

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

cgltf_bool
cgltf_accessor_read_uint
          (cgltf_accessor *accessor,cgltf_size index,cgltf_uint *out,cgltf_size element_size)

{
  cgltf_buffer_view *pcVar1;
  void *pvVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  cgltf_uint *pcVar6;
  ulong uVar7;
  cgltf_uint cVar8;
  
  if (accessor->is_sparse != 0) {
    return 0;
  }
  pcVar1 = accessor->buffer_view;
  if (pcVar1 == (cgltf_buffer_view *)0x0) {
    memset(out,0,element_size << 2);
  }
  else {
    pvVar2 = pcVar1->buffer->data;
    if (pvVar2 == (void *)0x0) {
      return 0;
    }
    uVar3 = accessor->type - cgltf_type_vec2;
    uVar7 = 1;
    if (uVar3 < 6) {
      uVar7 = *(ulong *)(&DAT_0017bff8 + (ulong)uVar3 * 8);
    }
    if (accessor->type - cgltf_type_mat2 < 3) {
      return 0;
    }
    if (element_size < uVar7) {
      return 0;
    }
    uVar3 = accessor->component_type - cgltf_component_type_r_8;
    if (uVar3 < 6) {
      lVar4 = *(long *)(&DAT_0017c028 + (ulong)uVar3 * 8);
    }
    else {
      lVar4 = 0;
    }
    pcVar6 = (cgltf_uint *)
             ((long)pvVar2 + index * accessor->stride + pcVar1->offset + accessor->offset);
    uVar5 = 0;
    do {
      cVar8 = 0;
      switch(uVar3) {
      case 0:
        cVar8 = (cgltf_uint)(char)(byte)*pcVar6;
        break;
      case 1:
        cVar8 = (cgltf_uint)(byte)*pcVar6;
        break;
      case 2:
        cVar8 = (cgltf_uint)(short)(ushort)*pcVar6;
        break;
      case 3:
        cVar8 = (cgltf_uint)(ushort)*pcVar6;
        break;
      case 4:
        cVar8 = *pcVar6;
      }
      out[uVar5] = cVar8;
      uVar5 = uVar5 + 1;
      pcVar6 = (cgltf_uint *)((long)pcVar6 + lVar4);
    } while (uVar7 != uVar5);
  }
  return 1;
}

Assistant:

cgltf_bool cgltf_accessor_read_uint(const cgltf_accessor* accessor, cgltf_size index, cgltf_uint* out, cgltf_size element_size)
{
    if (accessor->is_sparse)
    {
        return 0;
    }
    if (accessor->buffer_view == NULL)
    {
        memset(out, 0, element_size * sizeof( cgltf_uint ));
        return 1;
    }
    if (accessor->buffer_view->buffer->data == NULL)
    {
        return 0;
    }
    cgltf_size offset = accessor->offset + accessor->buffer_view->offset;
    const uint8_t* element = (const uint8_t*) accessor->buffer_view->buffer->data;
    element += offset + accessor->stride * index;
    return cgltf_element_read_uint(element, accessor->type, accessor->component_type, out, element_size);
}